

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i386.h
# Opt level: O3

OpCode i386::parse_opcode(Type t,string *o)

{
  int iVar1;
  OpCode OVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  OVar2 = unknown;
  if ((1 < t - Directive) && (OVar2 = unknown, t != Label)) {
    if (t != Instruction) {
LAB_00114ade:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_38,"Unknown opcode: ",o);
      std::runtime_error::runtime_error(this,(string *)&bStack_38);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = std::__cxx11::string::compare((char *)o);
    if (iVar1 == 0) {
      OVar2 = movzwl;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)o);
      if (iVar1 == 0) {
        OVar2 = movzbl;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)o);
        if (iVar1 == 0) {
          OVar2 = shrb;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)o);
          if (iVar1 == 0) {
            OVar2 = shrl;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)o);
            if (iVar1 == 0) {
              OVar2 = xorl;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)o);
              if (iVar1 == 0) {
                OVar2 = andl;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)o);
                if (iVar1 == 0) {
                  OVar2 = ret;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)o);
                  if (iVar1 == 0) {
                    OVar2 = movb;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)o);
                    if (iVar1 == 0) {
                      OVar2 = cmpb;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)o);
                      if (iVar1 == 0) {
                        OVar2 = movl;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)o);
                        if (iVar1 == 0) {
                          OVar2 = jmp;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)o);
                          if (iVar1 == 0) {
                            OVar2 = testb;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)o);
                            if (iVar1 == 0) {
                              OVar2 = incl;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)o);
                              if (iVar1 == 0) {
                                OVar2 = sarl;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)o);
                                if (iVar1 == 0) {
                                  OVar2 = decl;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)o);
                                  if (iVar1 == 0) {
                                    OVar2 = jne;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)o);
                                    if (iVar1 == 0) {
                                      OVar2 = je;
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)o);
                                      if (iVar1 == 0) {
                                        OVar2 = js;
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)o);
                                        if (iVar1 == 0) {
                                          OVar2 = subl;
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)o);
                                          if (iVar1 == 0) {
                                            OVar2 = subb;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)o);
                                            if (iVar1 == 0) {
                                              OVar2 = addl;
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)o);
                                              if (iVar1 == 0) {
                                                OVar2 = addb;
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare((char *)o);
                                                if (iVar1 == 0) {
                                                  OVar2 = sall;
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare((char *)o);
                                                  if (iVar1 == 0) {
                                                    OVar2 = orl;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare((char *)o)
                                                    ;
                                                    if (iVar1 == 0) {
                                                      OVar2 = andb;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)o);
                                                      if (iVar1 == 0) {
                                                        OVar2 = orb;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)o);
                                                        if (iVar1 == 0) {
                                                          OVar2 = decb;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)o);
                                                          if (iVar1 == 0) {
                                                            OVar2 = incb;
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)o);
                                                            if (iVar1 == 0) {
                                                              OVar2 = rep;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)o);
                                                              if (iVar1 == 0) {
                                                                OVar2 = notb;
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)o);
                                                                if (iVar1 == 0) {
                                                                  OVar2 = negb;
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)o);
                                                                  if (iVar1 == 0) {
                                                                    OVar2 = sbbb;
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)o);
                                                                    if (iVar1 == 0) {
                                                                      OVar2 = pushl;
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)o);
                                                                      if (iVar1 == 0) {
                                                                        OVar2 = popl;
                                                                      }
                                                                      else {
                                                                        iVar1 = std::__cxx11::string
                                                                                ::compare((char *)o)
                                                                        ;
                                                                        if (iVar1 == 0) {
                                                                          OVar2 = retl;
                                                                        }
                                                                        else {
                                                                          iVar1 = std::__cxx11::
                                                                                  string::compare((
                                                  char *)o);
                                                  if (iVar1 == 0) {
                                                    OVar2 = callw;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare((char *)o)
                                                    ;
                                                    if (iVar1 == 0) {
                                                      OVar2 = calll;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)o);
                                                      if (iVar1 == 0) {
                                                        OVar2 = movw;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)o);
                                                        OVar2 = hlt;
                                                        if (iVar1 != 0) goto LAB_00114ade;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return OVar2;
}

Assistant:

static OpCode parse_opcode(Type t, const std::string& o) {
		switch (t) {
			case Type::Label:
			case Type::Comment:
			case Type::Directive:
				return OpCode::unknown;
			case Type::Instruction: {
				if (o == "movzwl")
					return OpCode::movzwl;
				if (o == "movzbl")
					return OpCode::movzbl;
				if (o == "shrb")
					return OpCode::shrb;
				if (o == "shrl")
					return OpCode::shrl;
				if (o == "xorl")
					return OpCode::xorl;
				if (o == "andl")
					return OpCode::andl;
				if (o == "ret")
					return OpCode::ret;
				if (o == "movb")
					return OpCode::movb;
				if (o == "cmpb")
					return OpCode::cmpb;
				if (o == "movl")
					return OpCode::movl;
				if (o == "jmp")
					return OpCode::jmp;
				if (o == "testb")
					return OpCode::testb;
				if (o == "incl")
					return OpCode::incl;
				if (o == "sarl")
					return OpCode::sarl;
				if (o == "decl")
					return OpCode::decl;
				if (o == "jne")
					return OpCode::jne;
				if (o == "je")
					return OpCode::je;
				if (o == "js")
					return OpCode::js;
				if (o == "subl")
					return OpCode::subl;
				if (o == "subb")
					return OpCode::subb;
				if (o == "addl")
					return OpCode::addl;
				if (o == "addb")
					return OpCode::addb;
				if (o == "sall")
					return OpCode::sall;
				if (o == "orl")
					return OpCode::orl;
				if (o == "andb")
					return OpCode::andb;
				if (o == "orb")
					return OpCode::orb;
				if (o == "decb")
					return OpCode::decb;
				if (o == "incb")
					return OpCode::incb;
				if (o == "rep")
					return OpCode::rep;
				if (o == "notb")
					return OpCode::notb;
				if (o == "negb")
					return OpCode::negb;
				if (o == "sbbb")
					return OpCode::sbbb;
				if (o == "pushl")
					return OpCode::pushl;
				if (o == "popl")
					return OpCode::popl;
				if (o == "retl")
					return OpCode::retl;
				if (o == "callw")
					return OpCode::callw;
				if (o == "calll")
					return OpCode::calll;
				if (o == "movw")
					return OpCode::movw;
				if (o == "hlt")
					return OpCode::hlt;
			}
		}
		throw std::runtime_error("Unknown opcode: " + o);
	}